

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnTrainerSGD.cpp
# Opt level: O1

DNN_NUMERIC __thiscall tfs::DnnTrainerSGD::adjustWeights(DnnTrainerSGD *this)

{
  double dVar1;
  double dVar2;
  unsigned_long uVar3;
  double dVar4;
  Trainable **ppTVar5;
  Trainable *pTVar6;
  double *pdVar7;
  double *pdVar8;
  Trainable **ppTVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  bool bVar13;
  bool bVar14;
  double extraout_XMM0_Qa;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double *local_78;
  
  dVar15 = (this->super_DnnTrainer).m_momentum;
  if (dVar15 <= 0.0) {
    local_78 = (double *)0x0;
  }
  else {
    if ((this->super_DnnTrainer).m_gsum == (Matrix *)0x0) {
      DnnTrainer::setupSums(&this->super_DnnTrainer,false);
      dVar15 = extraout_XMM0_Qa;
    }
    local_78 = ((this->super_DnnTrainer).m_gsum)->m_data;
  }
  ppTVar9 = (this->super_DnnTrainer).m_trainable_handle;
  ppTVar5 = (this->super_DnnTrainer).m_trainable_end;
  do {
    if (ppTVar5 <= ppTVar9) {
      return (this->super_DnnTrainer).m_loss;
    }
    pTVar6 = *ppTVar9;
    pdVar11 = pTVar6->weightStart;
    if (pTVar6->gradientStart == (double *)0x0 || pdVar11 == (double *)0x0) {
      bVar13 = false;
      report_problem("Error",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainerSGD.cpp"
                     ,"adjustWeights",0x2c,"Trainable has weight or gradient == 0");
      dVar15 = (this->super_DnnTrainer).m_loss;
    }
    else {
      pdVar7 = pTVar6->weightEnd;
      pdVar8 = pTVar6->gradientEnd;
      dVar1 = (this->super_DnnTrainer).m_l2_decay;
      dVar16 = (this->super_DnnTrainer).m_l1_decay * pTVar6->l1_decay_mul;
      dVar2 = pTVar6->l2_decay_mul;
      pdVar12 = pTVar6->gradientStart;
      do {
        bVar13 = pdVar7 <= pdVar11;
        if (bVar13) break;
        uVar3 = (this->super_DnnTrainer).m_batch_size;
        if (pdVar12 < pdVar8) {
          dVar18 = *pdVar11;
          dVar17 = (dVar1 * dVar2 * dVar18 +
                    (double)(~-(ulong)(0.0 < dVar18) & (ulong)-dVar16 |
                            -(ulong)(0.0 < dVar18) & (ulong)dVar16) + *pdVar12) /
                   (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
          dVar4 = (this->super_DnnTrainer).m_momentum;
          if ((dVar4 <= 0.0) || (local_78 == (double *)0x0)) {
            dVar18 = dVar18 - dVar17 * (this->super_DnnTrainer).m_learning_rate;
          }
          else {
            dVar18 = dVar4 * *local_78 - dVar17 * (this->super_DnnTrainer).m_learning_rate;
            *local_78 = dVar18;
            local_78 = local_78 + 1;
            dVar18 = dVar18 + *pdVar11;
          }
          *pdVar11 = dVar18;
          pdVar11 = pdVar11 + 1;
          *pdVar12 = 0.0;
          pdVar10 = pdVar12 + 1;
        }
        else {
          report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainerSGD.cpp"
                         ,"adjustWeights",0x38,
                         "Trainable has gradient[] smaller than weight[] in size.");
          dVar15 = (this->super_DnnTrainer).m_loss;
          pdVar10 = pdVar12;
        }
        bVar14 = pdVar12 < pdVar8;
        pdVar12 = pdVar10;
      } while (bVar14);
    }
    ppTVar9 = ppTVar9 + 1;
    if (!bVar13) {
      return dVar15;
    }
  } while( true );
}

Assistant:

DNN_NUMERIC
    DnnTrainerSGD::adjustWeights( void ) {
        DNN_NUMERIC *gsum = 0;
        if( m_momentum > 0.0 ) {
            if( m_gsum == 0 ) {
                setupSums( false );  // setup only gsum[]
            }
            gsum = m_gsum->data();
        }
        
        Trainable **trainableHandle = m_trainable_handle;
        Trainable **trainableEnd    = m_trainable_end;
        
        while( trainableHandle < trainableEnd ) {
                  Trainable   *trainable   = *trainableHandle++;      // trainable != 0 & ok() from DnnTrainer::setUpTrainables()
                  DNN_NUMERIC *weight      = trainable->weightStart;
            const DNN_NUMERIC *weightEnd   = trainable->weightEnd;
                  DNN_NUMERIC *gradient    = trainable->gradientStart;
            const DNN_NUMERIC *gradientEnd = trainable->gradientEnd;
            const DNN_NUMERIC l1_decay     = m_l1_decay * trainable->l1_decay_mul;
            const DNN_NUMERIC l2_decay     = m_l2_decay * trainable->l2_decay_mul;
            
            if( weight == 0 || gradient == 0 ) {
                log_error( "Trainable has weight or gradient == 0" );
                return m_loss;
            }
            
            while( weight < weightEnd ) {
                const DNN_NUMERIC     ww = *weight;
                const DNN_NUMERIC l1grad = l1_decay * (ww > 0.0 ? 1.0 : -1.0);
                const DNN_NUMERIC l2grad = l2_decay * ww;
                
                const DNN_NUMERIC gij = ( l1grad + l2grad + *gradient ) / m_batch_size; // raw batch gradient
                
                if( gradient >= gradientEnd ) {
                    log_error( "Trainable has gradient[] smaller than weight[] in size." );
                    return m_loss;
                }
                if( m_momentum > 0.0 && gsum != 0 ) {
                    const DNN_NUMERIC dx = m_momentum * *gsum - m_learning_rate * gij;
                    *gsum++    = dx;    // Save next momentum iteration
                    *weight++ += dx;    // apply corrected gradient
                } else {
                    *weight++ -= m_learning_rate * gij;
                }
                *gradient++ = 0.0;
            }
        }
        return m_loss;
    }